

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

double DistanceToCapsuleAxisHelper(ON_RTreeCapsule *a_capsule,ON_RTreeBBox *a_rect)

{
  double s [2];
  double L [2] [3];
  ON_RTreeBBox *a_rect_local;
  ON_RTreeCapsule *a_capsule_local;
  
  if ((((a_capsule->m_domain[0] != 0.0) || (NAN(a_capsule->m_domain[0]))) ||
      (a_capsule->m_domain[1] != 1.0)) || (NAN(a_capsule->m_domain[1]))) {
    if ((a_capsule->m_domain[0] != 0.0) || (NAN(a_capsule->m_domain[0]))) {
      s[0] = a_capsule->m_domain[0];
      s[1] = (1.0 - a_capsule->m_domain[0]) * a_capsule->m_point[0][0] +
             s[0] * a_capsule->m_point[1][0];
    }
    else {
      s[1] = a_capsule->m_point[0][0];
    }
    if ((a_capsule->m_domain[1] != 0.0) || (NAN(a_capsule->m_domain[1]))) {
      s[0] = a_capsule->m_domain[1];
    }
    a_capsule_local =
         (ON_RTreeCapsule *)
         ON_BoundingBox::MinimumDistanceTo((ON_BoundingBox *)a_rect,(ON_Line *)(s + 1));
  }
  else {
    a_capsule_local =
         (ON_RTreeCapsule *)
         ON_BoundingBox::MinimumDistanceTo((ON_BoundingBox *)a_rect,(ON_Line *)a_capsule);
  }
  return (double)a_capsule_local;
}

Assistant:

static double DistanceToCapsuleAxisHelper(const struct ON_RTreeCapsule* a_capsule, const ON_RTreeBBox* a_rect)
{
  double L[2][3], s[2];
  if ( 0.0 == a_capsule->m_domain[0] && 1.0 == a_capsule->m_domain[1] )
    return ((const ON_BoundingBox*)a_rect->m_min)->MinimumDistanceTo( *((const ON_Line*)a_capsule->m_point[0]) );

  if ( 0.0 == a_capsule->m_domain[0] )
  {
    L[0][0] = a_capsule->m_point[0][0];
    L[0][1] = a_capsule->m_point[0][1];
    L[0][2] = a_capsule->m_point[0][2];
  }
  else
  {
    s[0] = 1.0 - a_capsule->m_domain[0];
    s[1] = a_capsule->m_domain[0];
    L[0][0] = s[0]*a_capsule->m_point[0][0] + s[1]*a_capsule->m_point[1][0];
    L[0][1] = s[0]*a_capsule->m_point[0][1] + s[1]*a_capsule->m_point[1][1];
    L[0][2] = s[0]*a_capsule->m_point[0][2] + s[1]*a_capsule->m_point[1][2];
  }

  if ( 0.0 == a_capsule->m_domain[1] )
  {
    L[1][0] = a_capsule->m_point[1][0];
    L[1][1] = a_capsule->m_point[1][1];
    L[1][2] = a_capsule->m_point[1][2];
  }
  else
  {
    s[0] = 1.0 - a_capsule->m_domain[1];
    s[1] = a_capsule->m_domain[1];
    L[1][0] = s[0]*a_capsule->m_point[0][0] + s[1]*a_capsule->m_point[1][0];
    L[1][1] = s[0]*a_capsule->m_point[0][1] + s[1]*a_capsule->m_point[1][1];
    L[1][2] = s[0]*a_capsule->m_point[0][2] + s[1]*a_capsule->m_point[1][2];
  }

  return ((const ON_BoundingBox*)a_rect->m_min)->MinimumDistanceTo( *((const ON_Line*)L[0]) );
}